

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawChannel *pIVar1;
  unsigned_short *__src;
  ImDrawChannel *pIVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ImDrawCmd *pIVar6;
  long lVar7;
  ImDrawCmd *pIVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  unsigned_short *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  uVar4 = 0;
  uVar12 = 0;
  SetCurrentChannel(this,draw_list,0);
  uVar16 = (draw_list->CmdBuffer).Size;
  if ((ulong)uVar16 == 0) {
    uVar3 = this->_Count;
    if (0 < (int)uVar3) goto LAB_001641dc;
  }
  else {
    if ((int)uVar16 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui.h"
                    ,0x50f,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    if ((draw_list->CmdBuffer).Data[(ulong)uVar16 - 1].ElemCount == 0) {
      uVar16 = uVar16 - 1;
      (draw_list->CmdBuffer).Size = uVar16;
    }
    uVar3 = this->_Count;
    uVar4 = uVar16;
    if (0 < (int)uVar3) {
      if (uVar16 == 0) {
        uVar12 = 0;
LAB_001641dc:
        pIVar6 = (ImDrawCmd *)0x0;
        uVar16 = 0;
      }
      else {
        pIVar8 = (draw_list->CmdBuffer).Data;
        pIVar6 = pIVar8 + ((ulong)uVar16 - 1);
        uVar12 = uVar16;
        if (pIVar6 == (ImDrawCmd *)0x0) goto LAB_001641dc;
        uVar16 = pIVar8[(ulong)uVar16 - 1].ElemCount + pIVar8[(ulong)uVar16 - 1].IdxOffset;
      }
      if (uVar3 < 2) {
        iVar10 = 0;
        iVar9 = 0;
        uVar4 = uVar12;
      }
      else {
        iVar9 = 0;
        lVar14 = 1;
        iVar10 = 0;
        do {
          if ((this->_Channels).Size <= lVar14) goto LAB_001644e4;
          pIVar1 = (this->_Channels).Data;
          pIVar2 = pIVar1 + lVar14;
          iVar11 = pIVar1[lVar14]._CmdBuffer.Size;
          uVar5 = (ulong)iVar11;
          if ((long)uVar5 < 1) {
LAB_001642d8:
            iVar13 = (pIVar2->_IdxBuffer).Size;
          }
          else {
            if ((pIVar2->_CmdBuffer).Data[uVar5 - 1].ElemCount == 0) {
              uVar5 = (ulong)(iVar11 - 1U);
              (pIVar2->_CmdBuffer).Size = iVar11 - 1U;
            }
            if (((int)uVar5 == 0) || (pIVar6 == (ImDrawCmd *)0x0)) {
LAB_001642ac:
              iVar11 = (int)uVar5;
              if (iVar11 < 1) goto LAB_001642d8;
            }
            else {
              pIVar8 = (pIVar2->_CmdBuffer).Data;
              auVar17[0] = -(*(char *)&(pIVar8->ClipRect).x == *(char *)&(pIVar6->ClipRect).x);
              auVar17[1] = -(*(char *)((long)&(pIVar8->ClipRect).x + 1) ==
                            *(char *)((long)&(pIVar6->ClipRect).x + 1));
              auVar17[2] = -(*(char *)((long)&(pIVar8->ClipRect).x + 2) ==
                            *(char *)((long)&(pIVar6->ClipRect).x + 2));
              auVar17[3] = -(*(char *)((long)&(pIVar8->ClipRect).x + 3) ==
                            *(char *)((long)&(pIVar6->ClipRect).x + 3));
              auVar17[4] = -(*(char *)&(pIVar8->ClipRect).y == *(char *)&(pIVar6->ClipRect).y);
              auVar17[5] = -(*(char *)((long)&(pIVar8->ClipRect).y + 1) ==
                            *(char *)((long)&(pIVar6->ClipRect).y + 1));
              auVar17[6] = -(*(char *)((long)&(pIVar8->ClipRect).y + 2) ==
                            *(char *)((long)&(pIVar6->ClipRect).y + 2));
              auVar17[7] = -(*(char *)((long)&(pIVar8->ClipRect).y + 3) ==
                            *(char *)((long)&(pIVar6->ClipRect).y + 3));
              auVar17[8] = -(*(char *)&(pIVar8->ClipRect).z == *(char *)&(pIVar6->ClipRect).z);
              auVar17[9] = -(*(char *)((long)&(pIVar8->ClipRect).z + 1) ==
                            *(char *)((long)&(pIVar6->ClipRect).z + 1));
              auVar17[10] = -(*(char *)((long)&(pIVar8->ClipRect).z + 2) ==
                             *(char *)((long)&(pIVar6->ClipRect).z + 2));
              auVar17[0xb] = -(*(char *)((long)&(pIVar8->ClipRect).z + 3) ==
                              *(char *)((long)&(pIVar6->ClipRect).z + 3));
              auVar17[0xc] = -(*(char *)&(pIVar8->ClipRect).w == *(char *)&(pIVar6->ClipRect).w);
              auVar17[0xd] = -(*(char *)((long)&(pIVar8->ClipRect).w + 1) ==
                              *(char *)((long)&(pIVar6->ClipRect).w + 1));
              auVar17[0xe] = -(*(char *)((long)&(pIVar8->ClipRect).w + 2) ==
                              *(char *)((long)&(pIVar6->ClipRect).w + 2));
              auVar17[0xf] = -(*(char *)((long)&(pIVar8->ClipRect).w + 3) ==
                              *(char *)((long)&(pIVar6->ClipRect).w + 3));
              if ((((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar17[0xf] >> 7) << 0xf) == 0xffff) &&
                  (((pIVar6->TextureId == pIVar8->TextureId &&
                    (pIVar6->VtxOffset == pIVar8->VtxOffset)) &&
                   (pIVar6->UserCallback == (ImDrawCallback)0x0)))) &&
                 (pIVar8->UserCallback == (ImDrawCallback)0x0)) {
                pIVar6->ElemCount = pIVar6->ElemCount + pIVar8->ElemCount;
                uVar16 = uVar16 + pIVar8->ElemCount;
                memmove(pIVar8,pIVar8 + 1,(uVar5 & 0xffffffff) * 0x38 - 0x38);
                uVar4 = (pIVar2->_CmdBuffer).Size - 1;
                uVar5 = (ulong)uVar4;
                (pIVar2->_CmdBuffer).Size = uVar4;
                goto LAB_001642ac;
              }
            }
            pIVar8 = (pIVar2->_CmdBuffer).Data;
            iVar11 = (int)uVar5;
            uVar5 = uVar5 & 0xffffffff;
            pIVar6 = pIVar8 + (uVar5 - 1);
            iVar13 = (pIVar2->_IdxBuffer).Size;
            do {
              pIVar8->IdxOffset = uVar16;
              uVar16 = uVar16 + pIVar8->ElemCount;
              pIVar8 = pIVar8 + 1;
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
          }
          iVar10 = iVar10 + iVar13;
          iVar9 = iVar9 + iVar11;
          lVar14 = lVar14 + 1;
        } while (lVar14 < this->_Count);
        uVar4 = (draw_list->CmdBuffer).Size;
      }
      goto LAB_00164305;
    }
  }
  iVar10 = 0;
  iVar9 = 0;
LAB_00164305:
  iVar13 = uVar4 + iVar9;
  iVar11 = (draw_list->CmdBuffer).Capacity;
  if (iVar11 < iVar13) {
    if (iVar11 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar11 / 2 + iVar11;
    }
    if (iVar11 <= iVar13) {
      iVar11 = iVar13;
    }
    pIVar6 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar11 * 0x38);
    pIVar8 = (draw_list->CmdBuffer).Data;
    if (pIVar8 != (ImDrawCmd *)0x0) {
      memcpy(pIVar6,pIVar8,(long)(draw_list->CmdBuffer).Size * 0x38);
      ImGui::MemFree((draw_list->CmdBuffer).Data);
    }
    (draw_list->CmdBuffer).Data = pIVar6;
    (draw_list->CmdBuffer).Capacity = iVar11;
  }
  (draw_list->CmdBuffer).Size = iVar13;
  lVar14 = (long)(draw_list->IdxBuffer).Size + (long)iVar10;
  iVar11 = (draw_list->IdxBuffer).Capacity;
  iVar13 = (int)lVar14;
  if (iVar11 < iVar13) {
    if (iVar11 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar11 / 2 + iVar11;
    }
    if (iVar11 <= iVar13) {
      iVar11 = iVar13;
    }
    local_40 = (unsigned_short *)ImGui::MemAlloc((long)iVar11 * 2);
    __src = (draw_list->IdxBuffer).Data;
    if (__src != (unsigned_short *)0x0) {
      memcpy(local_40,__src,(long)(draw_list->IdxBuffer).Size * 2);
      ImGui::MemFree((draw_list->IdxBuffer).Data);
    }
    (draw_list->IdxBuffer).Data = local_40;
    (draw_list->IdxBuffer).Capacity = iVar11;
  }
  else {
    local_40 = (draw_list->IdxBuffer).Data;
  }
  (draw_list->IdxBuffer).Size = iVar13;
  local_40 = local_40 + (lVar14 - iVar10);
  if (1 < this->_Count) {
    pIVar8 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar9);
    lVar15 = 1;
    lVar14 = 0x38;
    do {
      if ((this->_Channels).Size <= lVar15) {
LAB_001644e4:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui.h"
                      ,0x505,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar2 = (this->_Channels).Data;
      lVar7 = (long)*(int *)((long)pIVar2 + lVar14 + -0x18);
      if (lVar7 != 0) {
        memcpy(pIVar8,*(void **)((long)pIVar2 + lVar14 + -0x10),lVar7 * 0x38);
        pIVar8 = pIVar8 + lVar7;
      }
      lVar7 = (long)*(int *)((long)pIVar2 + lVar14 + -8);
      if (lVar7 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar2->_CmdBuffer).Size + lVar14),lVar7 * 2);
        local_40 = local_40 + lVar7;
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x20;
    } while (lVar15 < this->_Count);
  }
  draw_list->_IdxWritePtr = local_40;
  ImDrawList::UpdateClipRect(draw_list);
  ImDrawList::UpdateTextureID(draw_list);
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    if (draw_list->CmdBuffer.Size != 0 && draw_list->CmdBuffer.back().ElemCount == 0)
        draw_list->CmdBuffer.pop_back();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();
        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL && CanMergeDrawCommands(last_cmd, &ch._CmdBuffer[0]))
        {
            // Merge previous channel last draw command with current channel first draw command if matching.
            last_cmd->ElemCount += ch._CmdBuffer[0].ElemCount;
            idx_offset += ch._CmdBuffer[0].ElemCount;
            ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;
    draw_list->UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    draw_list->UpdateTextureID();
    _Count = 1;
}